

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

void __thiscall icu_63::MessagePattern::MessagePattern(MessagePattern *this,MessagePattern *other)

{
  ushort uVar1;
  UBool UVar2;
  ushort uVar3;
  UErrorCode errorCode;
  UErrorCode local_1c;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_003f6a60;
  this->aposMode = other->aposMode;
  UnicodeString::UnicodeString(&this->msg,&other->msg);
  this->partsLength = 0;
  this->partsList = (MessagePatternPartsList *)0x0;
  this->parts = (Part *)0x0;
  this->numericValuesList = (MessagePatternDoubleList *)0x0;
  this->numericValues = (double *)0x0;
  this->numericValuesLength = 0;
  this->hasArgNames = other->hasArgNames;
  this->hasArgNumbers = other->hasArgNumbers;
  this->needsAutoQuoting = other->needsAutoQuoting;
  local_1c = U_ZERO_ERROR;
  UVar2 = copyStorage(this,other,&local_1c);
  if (UVar2 == '\0') {
    uVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
    uVar3 = 2;
    if ((uVar1 & 1) == 0) {
      uVar3 = uVar1 & 0x1e;
    }
    (this->msg).fUnion.fStackFields.fLengthAndFlags = uVar3;
    this->partsLength = 0;
    *(undefined4 *)((long)&this->numericValuesLength + 3) = 0;
    this->numericValuesLength = 0;
  }
  return;
}

Assistant:

MessagePattern::MessagePattern(const MessagePattern &other)
        : UObject(other), aposMode(other.aposMode), msg(other.msg),
          partsList(NULL), parts(NULL), partsLength(0),
          numericValuesList(NULL), numericValues(NULL), numericValuesLength(0),
          hasArgNames(other.hasArgNames), hasArgNumbers(other.hasArgNumbers),
          needsAutoQuoting(other.needsAutoQuoting) {
    UErrorCode errorCode=U_ZERO_ERROR;
    if(!copyStorage(other, errorCode)) {
        clear();
    }
}